

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

wchar_t archive_filter_b64encode_options(archive_write_filter *f,char *key,char *value)

{
  uint *puVar1;
  int iVar2;
  size_t char_cnt;
  int64_t iVar3;
  size_t local_50;
  private_b64encode *state;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  puVar1 = (uint *)f->data;
  iVar2 = strcmp(key,"mode");
  if (iVar2 == 0) {
    if (value == (char *)0x0) {
      archive_set_error(f->archive,-1,"mode option requires octal digits");
      f_local._4_4_ = L'\xffffffe7';
    }
    else {
      char_cnt = strlen(value);
      iVar3 = atol8(value,char_cnt);
      *puVar1 = (uint)iVar3 & 0x1ff;
      f_local._4_4_ = L'\0';
    }
  }
  else {
    iVar2 = strcmp(key,"name");
    if (iVar2 == 0) {
      if (value == (char *)0x0) {
        archive_set_error(f->archive,-1,"name option requires a string");
        f_local._4_4_ = L'\xffffffe7';
      }
      else {
        puVar1[4] = 0;
        puVar1[5] = 0;
        if (value == (char *)0x0) {
          local_50 = 0;
        }
        else {
          local_50 = strlen(value);
        }
        archive_strncat((archive_string *)(puVar1 + 2),value,local_50);
        f_local._4_4_ = L'\0';
      }
    }
    else {
      f_local._4_4_ = L'\xffffffec';
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_filter_b64encode_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_b64encode *state = (struct private_b64encode *)f->data;

	if (strcmp(key, "mode") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "mode option requires octal digits");
			return (ARCHIVE_FAILED);
		}
		state->mode = (int)atol8(value, strlen(value)) & 0777;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "name") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "name option requires a string");
			return (ARCHIVE_FAILED);
		}
		archive_strcpy(&state->name, value);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}